

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr c4::decode_code_point(substr out,csubstr code_point)

{
  char cVar1;
  code *pcVar2;
  long lVar3;
  ulong uVar4;
  size_t len_;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  uint32_t code;
  int iVar8;
  ulong buflen;
  bool bVar9;
  substr sVar10;
  substr local_38;
  
  uVar5 = code_point.len;
  pcVar6 = code_point.str;
  buflen = out.len;
  if (buflen < 4) {
    decode_code_point();
  }
  if (1 < uVar5) {
    if (*pcVar6 == 'U') {
      lVar3 = 0;
      do {
        lVar7 = lVar3;
        if (lVar7 == 1) break;
        lVar3 = lVar7 + 1;
      } while (pcVar6[lVar7 + 1] == "U+"[lVar7 + 1]);
      if (lVar7 != 0) {
        decode_code_point();
      }
    }
    if (1 < uVar5) {
      if (*pcVar6 == '\\') {
        lVar3 = 0;
        do {
          lVar7 = lVar3;
          if (lVar7 == 1) break;
          lVar3 = lVar7 + 1;
        } while (pcVar6[lVar7 + 1] == "\\x"[lVar7 + 1]);
        if (lVar7 != 0) {
          decode_code_point();
        }
      }
      if (1 < uVar5) {
        if (*pcVar6 == '\\') {
          lVar3 = 0;
          do {
            lVar7 = lVar3;
            if (lVar7 == 1) break;
            lVar3 = lVar7 + 1;
          } while (pcVar6[lVar7 + 1] == "\\u"[lVar7 + 1]);
          if (lVar7 != 0) {
            decode_code_point();
          }
        }
        if ((1 < uVar5) && (*pcVar6 == '\\')) {
          lVar3 = 0;
          do {
            lVar7 = lVar3;
            if (lVar7 == 1) break;
            lVar3 = lVar7 + 1;
          } while (pcVar6[lVar7 + 1] == "\\U"[lVar7 + 1]);
          if (lVar7 != 0) {
            decode_code_point();
          }
        }
      }
    }
  }
  if ((uVar5 != 0) && (*pcVar6 == '0')) {
    decode_code_point();
  }
  if (8 < uVar5) {
    decode_code_point();
  }
  if (uVar5 == 0) {
    decode_code_point();
  }
  else if (pcVar6 != (char *)0x0) {
    bVar9 = uVar5 == 0;
    if (bVar9) {
      code = 0;
    }
    else {
      uVar4 = 0;
      code = 0;
      do {
        cVar1 = pcVar6[uVar4];
        iVar8 = -0x30;
        if (((9 < (byte)(cVar1 - 0x30U)) && (iVar8 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) &&
           (iVar8 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) {
          if (!bVar9) {
            decode_code_point();
          }
          break;
        }
        code = code * 0x10 + iVar8 + (int)cVar1;
        uVar4 = uVar4 + 1;
        bVar9 = uVar5 == uVar4;
      } while (!bVar9);
    }
    len_ = decode_code_point((uint8_t *)out.str,buflen,code);
    if (len_ <= buflen) {
      basic_substring<char>::basic_substring(&local_38,out.str,len_);
      return local_38;
    }
    if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar2 = (code *)swi(3);
      sVar10 = (substr)(*pcVar2)();
      return sVar10;
    }
    handle_error(0x24a7ca,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x154e,"num <= len || num == npos");
  }
  if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
    pcVar2 = (code *)swi(3);
    sVar10 = (substr)(*pcVar2)();
    return sVar10;
  }
  handle_error(0x24a7ca,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x2cac,"!s.empty()");
}

Assistant:

substr decode_code_point(substr out, csubstr code_point)
{
    C4_ASSERT(out.len >= 4);
    C4_ASSERT(!code_point.begins_with("U+"));
    C4_ASSERT(!code_point.begins_with("\\x"));
    C4_ASSERT(!code_point.begins_with("\\u"));
    C4_ASSERT(!code_point.begins_with("\\U"));
    C4_ASSERT(!code_point.begins_with('0'));
    C4_ASSERT(code_point.len <= 8);
    C4_ASSERT(code_point.len > 0);
    uint32_t code_point_val;
    C4_CHECK(read_hex(code_point, &code_point_val));
    size_t ret = decode_code_point((uint8_t*)out.str, out.len, code_point_val);
    C4_ASSERT(ret <= 4);
    return out.first(ret);
}